

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HeaderStructs.cpp
# Opt level: O0

void readBup<BupHeaderPS3>(istream *stream,BupHeader *header)

{
  bool bVar1;
  char *pcVar2;
  ostream *poVar3;
  ulong uVar4;
  undefined1 *in_RSI;
  long in_RDI;
  BupExpressionChunkPS3 c_1;
  value_type *expChunk;
  size_t i;
  BupChunkPS3 c;
  BupChunk *chunk;
  iterator __end1;
  iterator __begin1;
  vector<BupChunk,_std::allocator<BupChunk>_> *__range1;
  BupHeaderPS3 h;
  istream *in_stack_fffffffffffffed8;
  BupExpressionChunkPS3 *in_stack_fffffffffffffee0;
  BupHeaderPS3 *in_stack_fffffffffffffee8;
  char *src;
  BupHeader *in_stack_fffffffffffffef0;
  long lVar5;
  BupExpressionChunkPS3 *in_stack_fffffffffffffef8;
  BupExpressionChunk *in_stack_ffffffffffffff00;
  string local_f8 [16];
  unsigned_long in_stack_ffffffffffffff18;
  string local_d8 [32];
  string local_b8 [36];
  BupExpressionChunkPS3 local_94;
  reference local_68;
  char *local_60;
  uint32_le local_54;
  reference local_50;
  BupChunk *local_48;
  __normal_iterator<BupChunk_*,_std::vector<BupChunk,_std::allocator<BupChunk>_>_> local_40;
  undefined1 *local_38;
  undefined1 *local_10;
  long local_8;
  
  *in_RSI = 0;
  local_10 = in_RSI;
  local_8 = in_RDI;
  readRaw<BupHeaderPS3>((istream *)in_stack_fffffffffffffee0);
  copyTo<BupHeaderPS3>(in_stack_fffffffffffffef0,in_stack_fffffffffffffee8);
  lVar5 = local_8;
  boost::endian::endian_buffer<(boost::endian::order)1,_unsigned_int,_32UL,_(boost::endian::align)0>
  ::value((endian_buffer<(boost::endian::order)1,_unsigned_int,_32UL,_(boost::endian::align)0> *)
          0x1180ba);
  std::istream::ignore(lVar5);
  local_38 = local_10 + 0x10;
  local_40._M_current =
       (BupChunk *)
       std::vector<BupChunk,_std::allocator<BupChunk>_>::begin
                 ((vector<BupChunk,_std::allocator<BupChunk>_> *)in_stack_fffffffffffffed8);
  local_48 = (BupChunk *)
             std::vector<BupChunk,_std::allocator<BupChunk>_>::end
                       ((vector<BupChunk,_std::allocator<BupChunk>_> *)in_stack_fffffffffffffed8);
  while (bVar1 = __gnu_cxx::operator!=
                           ((__normal_iterator<BupChunk_*,_std::vector<BupChunk,_std::allocator<BupChunk>_>_>
                             *)in_stack_fffffffffffffee0,
                            (__normal_iterator<BupChunk_*,_std::vector<BupChunk,_std::allocator<BupChunk>_>_>
                             *)in_stack_fffffffffffffed8), bVar1) {
    local_50 = __gnu_cxx::
               __normal_iterator<BupChunk_*,_std::vector<BupChunk,_std::allocator<BupChunk>_>_>::
               operator*(&local_40);
    local_54.value_ = (uchar  [4])readRaw<BupChunkPS3>(in_stack_fffffffffffffed8);
    copyTo<BupChunkPS3>((BupChunk *)in_stack_fffffffffffffee0,
                        (BupChunkPS3 *)in_stack_fffffffffffffed8);
    __gnu_cxx::__normal_iterator<BupChunk_*,_std::vector<BupChunk,_std::allocator<BupChunk>_>_>::
    operator++(&local_40);
  }
  std::istream::ignore(local_8);
  local_60 = (char *)0x0;
  while (src = local_60,
        pcVar2 = (char *)std::vector<BupExpressionChunk,_std::allocator<BupExpressionChunk>_>::size
                                   ((vector<BupExpressionChunk,_std::allocator<BupExpressionChunk>_>
                                     *)(local_10 + 0x28)), src < pcVar2) {
    local_68 = std::vector<BupExpressionChunk,_std::allocator<BupExpressionChunk>_>::operator[]
                         ((vector<BupExpressionChunk,_std::allocator<BupExpressionChunk>_> *)
                          (local_10 + 0x28),(size_type)local_60);
    readRaw<BupExpressionChunkPS3>((istream *)in_stack_fffffffffffffee0);
    copyTo<BupExpressionChunkPS3>(in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
    in_stack_fffffffffffffee0 = &local_94;
    strnlen(local_94.name,0x10);
    toUTF8_abi_cxx11_(src,(size_t)in_stack_fffffffffffffee0);
    std::__cxx11::string::operator=((string *)local_68,local_b8);
    std::__cxx11::string::~string(local_b8);
    bVar1 = BupExpressionChunkPS3::unkBytesValid(&local_94);
    if (!bVar1) {
      poVar3 = std::operator<<((ostream *)&std::cerr,"Expression ");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,(ulong)local_60);
      poVar3 = std::operator<<(poVar3,", ");
      poVar3 = std::operator<<(poVar3,(string *)local_68);
      poVar3 = std::operator<<(poVar3,", had unexpected nonzero values in its expression data...");
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    }
    uVar4 = std::__cxx11::string::empty();
    if ((uVar4 & 1) != 0) {
      std::__cxx11::to_string(in_stack_ffffffffffffff18);
      std::operator+(src,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         in_stack_fffffffffffffee0);
      std::__cxx11::string::operator=((string *)local_68,local_d8);
      std::__cxx11::string::~string(local_d8);
      std::__cxx11::string::~string(local_f8);
    }
    local_60 = local_60 + 1;
  }
  return;
}

Assistant:

void readBup(std::istream& stream, BupHeader& header) {
	header.isSwitch = Header::IsSwitch::value;
	Header h = readRaw<Header>(stream);
	copyTo(header, h);

	// Skip bytes for unknown reason
	stream.ignore(h.tbl1.value() * h.skipAmount);

	for (auto& chunk : header.chunks) {
		auto c = readRaw<typename Header::Chunk>(stream);
		copyTo(chunk, c);
	}

	stream.ignore(h.skipAmount2);

	for (size_t i = 0; i < header.expChunks.size(); i++) {
		auto& expChunk = header.expChunks[i];

		auto c = readRaw<typename Header::ExpressionChunk>(stream);
		copyTo(expChunk, c);
		expChunk.name = toUTF8(c.name, strnlen(c.name, sizeof(c.name)));

		if (!c.unkBytesValid()) {
			std::cerr << "Expression " << i << ", " << expChunk.name << ", had unexpected nonzero values in its expression data..." << std::endl;
		}

		if (expChunk.name.empty()) {
			expChunk.name = "expression" + std::to_string(i);
		}
	}
}